

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O2

void __thiscall
Diffusion::diffuse_scalar
          (Diffusion *this,Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *S_old,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *Rho_old,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *S_new,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *Rho_new,int S_comp,
          int nComp,int Rho_comp,Real prev_time,Real curr_time,Real be_cn_theta,MultiFab *rho_half,
          int rho_flag,MultiFab **fluxn,MultiFab **fluxnp1,int fluxComp,MultiFab *delta_rhs,
          int rhsComp,MultiFab *alpha_in,int alpha_in_comp,MultiFab **betan,MultiFab **betanp1,
          int betaComp,IntVect *cratio,BCRec *bc,Geometry *geom,bool add_old_time_divFlux,
          Vector<int,_std::allocator<int>_> *a_is_diffusive)

{
  BoxArray *bxs;
  DistributionMapping *dm;
  int *piVar1;
  IndexType *pIVar2;
  pointer ppMVar3;
  MultiFab *pMVar4;
  __uniq_ptr_data<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>,_true,_true>
  factory;
  Real a_tol_rel;
  ostream *poVar5;
  Print *pPVar6;
  FabArray<amrex::FArrayBox> *this_00;
  EBFArrayBoxFactory *pEVar7;
  MultiFab *pMVar8;
  long lVar9;
  long lVar10;
  double *pdVar11;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *pVVar12;
  ulong uVar13;
  ulong uVar14;
  double *pdVar15;
  double *pdVar16;
  long lVar17;
  long lVar18;
  int idim;
  int iVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  double *pdVar24;
  Diffusion *this_01;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  double *pdVar32;
  double *pdVar33;
  double *pdVar34;
  int j;
  long lVar35;
  BoxArray *pBVar36;
  long lVar37;
  long lVar38;
  double *pdVar39;
  long lVar40;
  long lVar41;
  bool bVar42;
  double dVar43;
  Real a_tol_abs;
  double dVar44;
  initializer_list<amrex::Geometry> __l;
  initializer_list<amrex::BoxArray> __l_00;
  initializer_list<amrex::DistributionMapping> __l_01;
  initializer_list<const_amrex::EBFArrayBoxFactory_*> __l_02;
  initializer_list<amrex::Geometry> __l_03;
  initializer_list<amrex::BoxArray> __l_04;
  initializer_list<amrex::DistributionMapping> __l_05;
  initializer_list<const_amrex::EBFArrayBoxFactory_*> __l_06;
  initializer_list<amrex::MultiFab_*> __l_07;
  initializer_list<amrex::MultiFab_*> __l_08;
  initializer_list<amrex::MultiFab_*> __l_09;
  initializer_list<const_amrex::MultiFab_*> __l_10;
  double *local_1460;
  DistributionMapping *local_1450;
  long local_1448;
  long local_1440;
  double *local_1420;
  pair<double,_double> scalars;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_13a8;
  int local_1390;
  int local_1378;
  allocator_type local_1372;
  allocator_type local_1371;
  Array4<const_double> local_1370;
  Real local_1330;
  Array4<double> local_1328;
  long local_12e8;
  long local_12e0;
  Array4<const_double> local_12d8;
  long local_1290;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *local_1288;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *local_1280;
  double *local_1278;
  int local_1270;
  int allnull;
  Diffusion *local_1268;
  MultiFab *local_1260;
  long local_1258;
  long local_1250;
  long local_1248;
  double *local_1240;
  Real rhsscale;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1230;
  long local_1228;
  Long LStack_1220;
  Dim3 local_1218;
  undefined1 local_120c [24];
  Box local_11f4;
  double local_11d8;
  long local_11d0;
  long local_11c8;
  long local_11c0;
  long local_11b8;
  long local_11b0;
  double *local_11a8;
  long local_11a0;
  long local_1198;
  long local_1190;
  ulong local_1188;
  long local_1180;
  long local_1178;
  long local_1170;
  long local_1168;
  long local_1160;
  long local_1158;
  long local_1150;
  long local_1148;
  long local_1140;
  long local_1138;
  long local_1130;
  long local_1128;
  long local_1120;
  double *local_1118;
  long local_1110;
  long local_1108;
  long local_1100;
  long local_10f8;
  long local_10f0;
  long local_10e8;
  long local_10e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_10d8;
  long local_10d0;
  long local_10c8;
  long local_10c0;
  long local_10b8;
  double *local_10b0;
  long local_10a8;
  long local_10a0;
  long local_1098;
  long local_1090;
  long local_1088;
  long local_1080;
  LPInfo local_1074;
  int allthere;
  LPInfo local_1050;
  Array4<const_double> local_1030;
  MultiFab rhs_tmp;
  Array4<const_double> local_e68;
  array<amrex::LinOpBCType,_3UL> mlmg_hibc;
  array<amrex::LinOpBCType,_3UL> mlmg_lobc;
  MultiFab Soln;
  MLMG mgnp1;
  MLMG mgn;
  MLEBABecLap opn;
  MultiFab Rhs;
  MLEBABecLap opnp1;
  
  local_1330 = be_cn_theta;
  local_1288 = Rho_new;
  local_1280 = Rho_old;
  if (verbose != 0) {
    poVar5 = amrex::OutStream();
    amrex::Print::Print((Print *)&opn,poVar5);
    piVar1 = &opn.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.con_grid_size;
    std::operator<<((ostream *)piVar1,"... Diffusion::diffuse_scalar(): \n");
    std::operator<<((ostream *)piVar1," lev: ");
    pPVar6 = amrex::Print::operator<<((Print *)&opn,&this->level);
    std::operator<<((ostream *)&pPVar6->ss,'\n');
    amrex::Print::~Print((Print *)&opn);
  }
  local_1268 = this;
  if (0 < S_comp + nComp && S_comp < 1) {
    amrex::Abort_host(
                     "Diffusion::diffuse_scalar(): velocity component(s) attemping to use scalar solver. Velocity must use tensor solver.\n"
                     );
  }
  iVar19 = *(a_is_diffusive->super_vector<int,_std::allocator<int>_>).
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  local_1260 = rho_half;
  local_1378 = Rho_comp;
  for (lVar35 = 1; lVar35 < nComp; lVar35 = lVar35 + 1) {
    if ((a_is_diffusive->super_vector<int,_std::allocator<int>_>).
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [lVar35] != iVar19) {
      amrex::Abort_host(
                       "All the scalars must be either diffusive or non-diffusive when calling diffuse_scalar"
                       );
    }
  }
  if (iVar19 == 0) {
    for (lVar35 = 0; lVar35 != 3; lVar35 = lVar35 + 1) {
      if ((&fluxn[lVar35]->super_FabArray<amrex::FArrayBox> != (FabArray<amrex::FArrayBox> *)0x0) &&
         (fluxnp1[lVar35] != (MultiFab *)0x0)) {
        amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  (&fluxn[lVar35]->super_FabArray<amrex::FArrayBox>,0.0,fluxComp,nComp,0);
        amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  (&fluxnp1[lVar35]->super_FabArray<amrex::FArrayBox>,0.0,fluxComp,nComp,0);
      }
    }
  }
  else {
    local_1290 = (long)(S_new->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                       super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(S_new->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                       super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                       _M_impl.super__Vector_impl_data._M_start;
    local_11d8 = amrex::ParallelDescriptor::second();
    this_01 = (Diffusion *)betan;
    checkBeta(betan,&allthere,&allnull);
    checkBeta(this_01,betanp1,&allthere);
    bVar42 = local_1330 != 1.0;
    if ((bVar42 && add_old_time_divFlux) && (allnull != 0)) {
      amrex::Abort_host(
                       "Diffusion::diffuse_scalar: Constant diffusivity case no longer supported separately. Must set non-zero beta."
                       );
    }
    ppMVar3 = (S_new->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
              super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pMVar8 = *ppMVar3;
    bxs = &(pMVar8->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray;
    dm = &(pMVar8->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap;
    if (local_1290 < 9) {
      local_1450 = (DistributionMapping *)0x0;
      pBVar36 = (BoxArray *)0x0;
    }
    else {
      pMVar4 = ppMVar3[1];
      local_1450 = &(pMVar4->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap;
      pBVar36 = &(pMVar4->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray;
    }
    factory.
    super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
    .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
         (pMVar8->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
         super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
    ;
    opn.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp = (_func_int **)0x1;
    opn.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.do_agglomeration = false;
    opn.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.do_consolidation = false;
    opn.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.do_semicoarsening = false;
    opn.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info._3_1_ = 0;
    opn.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.agg_grid_size = 0;
    opn.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.con_grid_size = 0;
    opn.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.has_metric_term = false;
    opn.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info._13_3_ = 0;
    opn.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.max_coarsening_level = 0;
    opn.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.max_semicoarsening_level = 0;
    opn.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.semicoarsening_direction = 0;
    opn.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.hidden_direction = 0;
    amrex::MultiFab::MultiFab
              (&Rhs,bxs,dm,nComp,0,(MFInfo *)&opn,
               (FabFactory<amrex::FArrayBox> *)
               factory.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&opn.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.con_grid_size);
    opn.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp = (_func_int **)0x1;
    opn.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.do_agglomeration = false;
    opn.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.do_consolidation = false;
    opn.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.do_semicoarsening = false;
    opn.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info._3_1_ = 0;
    opn.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.agg_grid_size = 0;
    opn.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.con_grid_size = 0;
    opn.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.has_metric_term = false;
    opn.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info._13_3_ = 0;
    opn.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.max_coarsening_level = 0;
    opn.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.max_semicoarsening_level = 0;
    opn.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.semicoarsening_direction = 0;
    opn.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.hidden_direction = 0;
    amrex::MultiFab::MultiFab
              (&Soln,bxs,dm,nComp,1,(MFInfo *)&opn,
               (FabFactory<amrex::FArrayBox> *)
               factory.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&opn.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.con_grid_size);
    this_00 = (FabArray<amrex::FArrayBox> *)operator_new(0x180);
    amrex::MultiFab::MultiFab((MultiFab *)this_00);
    if (8 < local_1290) {
      opn.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp = (_func_int **)0x1;
      opn.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.do_agglomeration = false;
      opn.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.do_consolidation = false;
      opn.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.do_semicoarsening = false;
      opn.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info._3_1_ = 0;
      opn.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.agg_grid_size = 0;
      opn.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.con_grid_size = 0;
      opn.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.has_metric_term = false;
      opn.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info._13_3_ = 0;
      opn.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.max_coarsening_level = 0;
      opn.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.max_semicoarsening_level = 0;
      opn.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.semicoarsening_direction = 0;
      opn.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.hidden_direction = 0;
      (*(this_00->super_FabArrayBase)._vptr_FabArrayBase[2])
                (this_00,pBVar36,local_1450,(ulong)(uint)nComp,0,&opn,
                 (tuple<amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                  )((S_new->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[1]->super_FabArray<amrex::FArrayBox>).
                   m_factory._M_t.
                   super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                );
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&opn.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.con_grid_size);
    }
    local_1050.do_semicoarsening = false;
    local_1050.agg_grid_size = -1;
    local_1050.con_grid_size = -1;
    local_1050.do_agglomeration = (anonymous_namespace)::agglomeration != 0;
    local_1050.has_metric_term = true;
    local_1050.do_consolidation = (anonymous_namespace)::consolidation != 0;
    local_1050.max_coarsening_level = 0;
    local_1050.max_semicoarsening_level = 0;
    local_1050.semicoarsening_direction = -1;
    local_1050.hidden_direction = -1;
    pEVar7 = (EBFArrayBoxFactory *)
             __dynamic_cast(factory.
                            super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                            .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                            _M_head_impl,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                            &amrex::EBFArrayBoxFactory::typeinfo,0);
    if (pEVar7 == (EBFArrayBoxFactory *)0x0) {
      __cxa_bad_cast();
    }
    memcpy(&opnp1,geom,200);
    __l._M_len = 1;
    __l._M_array = (iterator)&opnp1;
    std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::vector
              ((vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)&mgnp1,__l,
               (allocator_type *)&rhsscale);
    amrex::BoxArray::BoxArray((BoxArray *)&mgn,bxs);
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&mgn;
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
              ((vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)&rhs_tmp,__l_00,
               (allocator_type *)&local_1030);
    std::__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> *)
               &local_1328,
               (__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> *)dm);
    __l_01._M_len = 1;
    __l_01._M_array = (iterator)&local_1328;
    std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::vector
              ((vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               &scalars,__l_01,(allocator_type *)&local_e68);
    __l_02._M_len = 1;
    __l_02._M_array = (iterator)&local_12d8;
    local_12d8.p = (double *)pEVar7;
    std::
    vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>::
    vector((vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
            *)&local_1370,__l_02,(allocator_type *)&local_1074);
    amrex::MLEBABecLap::MLEBABecLap
              (&opn,(Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)&mgnp1,
               (Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)&rhs_tmp,
               (Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               &scalars,&local_1050,
               (Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
                *)&local_1370,nComp);
    std::
    _Vector_base<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
    ::~_Vector_base((_Vector_base<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
                     *)&local_1370);
    std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::~vector
              ((vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               &scalars);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1328.jstride);
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~vector
              ((vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)&rhs_tmp);
    amrex::BoxArray::~BoxArray((BoxArray *)&mgn);
    std::_Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>::~_Vector_base
              ((_Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)&mgnp1);
    opn.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.maxorder = max_order;
    amrex::MLMG::MLMG(&mgn,(MLLinOp *)&opn);
    local_1074.do_semicoarsening = false;
    local_1074.agg_grid_size = -1;
    local_1074.con_grid_size = -1;
    local_1074.has_metric_term = true;
    local_1074.do_agglomeration = (anonymous_namespace)::agglomeration != 0;
    local_1074.max_coarsening_level = 0x1e;
    local_1074.max_semicoarsening_level = 0;
    local_1074.semicoarsening_direction = -1;
    local_1074.hidden_direction = -1;
    local_1074.do_consolidation = (anonymous_namespace)::consolidation != 0;
    mgn.verbose = verbose;
    memcpy(&mgnp1,geom,200);
    __l_03._M_len = 1;
    __l_03._M_array = (iterator)&mgnp1;
    std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::vector
              ((vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)&scalars,__l_03,
               (allocator_type *)&local_e68);
    amrex::BoxArray::BoxArray((BoxArray *)&rhs_tmp,bxs);
    __l_04._M_len = 1;
    __l_04._M_array = (iterator)&rhs_tmp;
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
              ((vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)&local_1370,__l_04,
               (allocator_type *)&local_11f4);
    std::__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> *)
               &rhsscale,
               (__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> *)dm);
    __l_05._M_len = 1;
    __l_05._M_array = (iterator)&rhsscale;
    std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::vector
              ((vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               &local_1328,__l_05,&local_1371);
    __l_06._M_len = 1;
    __l_06._M_array = (iterator)&local_1030;
    local_1030.p = (double *)pEVar7;
    std::
    vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>::
    vector((vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
            *)&local_12d8,__l_06,&local_1372);
    amrex::MLEBABecLap::MLEBABecLap
              (&opnp1,(Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)&scalars,
               (Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)&local_1370,
               (Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               &local_1328,&local_1074,
               (Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
                *)&local_12d8,nComp);
    std::
    _Vector_base<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
    ::~_Vector_base((_Vector_base<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
                     *)&local_12d8);
    std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::~vector
              ((vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               &local_1328);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1230);
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~vector
              ((vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)&local_1370);
    amrex::BoxArray::~BoxArray((BoxArray *)&rhs_tmp);
    std::_Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>::~_Vector_base
              ((_Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)&scalars);
    opnp1.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.maxorder = max_order;
    amrex::MLMG::MLMG(&mgnp1,(MLLinOp *)&opnp1);
    mgnp1.max_fmg_iters = (anonymous_namespace)::max_fmg_iter;
    mgnp1.verbose = verbose;
    setDomainBC(&mlmg_lobc,&mlmg_hibc,bc);
    amrex::MLLinOp::setDomainBC((MLLinOp *)&opn,&mlmg_lobc,&mlmg_hibc);
    amrex::MLLinOp::setDomainBC((MLLinOp *)&opnp1,&mlmg_lobc,&mlmg_hibc);
    if (verbose != 0) {
      poVar5 = amrex::OutStream();
      amrex::Print::Print((Print *)&rhs_tmp,poVar5);
      pIVar2 = &rhs_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
                m_bndryReg.m_typ;
      std::operator<<((ostream *)pIVar2,"diffusing of ");
      std::ostream::operator<<(pIVar2,nComp);
      std::operator<<((ostream *)pIVar2," scalars \n");
      std::operator<<((ostream *)pIVar2,"rho flag ");
      std::ostream::operator<<(pIVar2,rho_flag);
      std::operator<<((ostream *)pIVar2,"\n");
      amrex::Print::~Print((Print *)&rhs_tmp);
    }
    dVar43 = curr_time - prev_time;
    if (bVar42 && add_old_time_divFlux) {
      if (verbose != 0) {
        poVar5 = amrex::OutStream();
        amrex::Print::Print((Print *)&rhs_tmp,poVar5);
        std::operator<<((ostream *)
                        &rhs_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.
                         m_op.m_bndryReg.m_typ,"Adding old time diff ...\n");
        amrex::Print::~Print((Print *)&rhs_tmp);
      }
      if (8 < local_1290) {
        amrex::MultiFab::Copy
                  ((MultiFab *)this_00,
                   (S_old->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                   super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl
                   .super__Vector_impl_data._M_start[1],S_comp,0,nComp,0);
        if (rho_flag == 2) {
          amrex::MFIter::MFIter((MFIter *)&rhs_tmp,(FabArrayBase *)this_00,true);
          uVar13 = 0;
          if (0 < nComp) {
            uVar13 = (ulong)(uint)nComp;
          }
          while (rhs_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
                 m_bndryReg.m_loshft.vect[0] <
                 rhs_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
                 m_bndryReg.m_loshft.vect[2]) {
            amrex::MFIter::tilebox((Box *)&local_1328,(MFIter *)&rhs_tmp);
            amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      ((Array4<double> *)&scalars,this_00,(MFIter *)&rhs_tmp);
            amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&local_1370,
                       &(local_1280->
                        super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                        _M_impl.super__Vector_impl_data._M_start[1]->
                        super_FabArray<amrex::FArrayBox>,(MFIter *)&rhs_tmp,Rho_comp);
            lVar35 = (long)(int)local_1328.jstride;
            local_1460 = (double *)
                         ((lVar35 - local_1390) *
                          (long)vStack_13a8.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start * 8 +
                          ((long)local_1328.p._4_4_ -
                          (long)vStack_13a8.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) *
                          (long)scalars.second * 8 + (long)(int)local_1328.p * 8 +
                          (long)(int)vStack_13a8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage * -8 +
                         (long)scalars.first);
            for (; lVar35 <= local_1328.kstride._4_4_; lVar35 = lVar35 + 1) {
              pdVar24 = local_1460;
              for (lVar27 = (long)local_1328.p._4_4_; lVar27 <= (int)local_1328.kstride;
                  lVar27 = lVar27 + 1) {
                if ((int)local_1328.p <= local_1328.jstride._4_4_) {
                  pdVar33 = pdVar24;
                  lVar37 = (long)(int)local_1328.p;
                  do {
                    dVar44 = local_1370.p
                             [(lVar35 - local_1370.begin.z) * local_1370.kstride +
                              (lVar27 - local_1370.begin.y) * local_1370.jstride +
                              (lVar37 - local_1370.begin.x)];
                    uVar20 = uVar13;
                    pdVar15 = pdVar33;
                    while (bVar42 = uVar20 != 0, uVar20 = uVar20 - 1, bVar42) {
                      *pdVar15 = *pdVar15 * (1.0 / dVar44);
                      pdVar15 = pdVar15 + (long)vStack_13a8.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish;
                    }
                    lVar37 = lVar37 + 1;
                    pdVar33 = pdVar33 + 1;
                  } while (local_1328.jstride._4_4_ + 1 != (int)lVar37);
                }
                pdVar24 = pdVar24 + (long)scalars.second;
              }
              local_1460 = local_1460 +
                           (long)vStack_13a8.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
            }
            amrex::MFIter::operator++((MFIter *)&rhs_tmp);
          }
          amrex::MFIter::~MFIter((MFIter *)&rhs_tmp);
        }
        amrex::MLLinOp::setCoarseFineBC((MLLinOp *)&opn,(MultiFab *)this_00,cratio->vect[0]);
      }
      amrex::MultiFab::Copy
                (&Soln,*(S_old->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>)
                        .super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,S_comp,0,nComp,1);
      if (rho_flag == 2) {
        amrex::MFIter::MFIter((MFIter *)&rhs_tmp,(FabArrayBase *)&Soln,true);
        uVar13 = 0;
        if (0 < nComp) {
          uVar13 = (ulong)(uint)nComp;
        }
        while (rhs_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
               m_bndryReg.m_loshft.vect[0] <
               rhs_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
               m_bndryReg.m_loshft.vect[2]) {
          amrex::MFIter::growntilebox((Box *)&local_1328,(MFIter *)&rhs_tmp,1);
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)&scalars,&Soln.super_FabArray<amrex::FArrayBox>,
                     (MFIter *)&rhs_tmp);
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_1370,
                     &(*(local_1280->
                        super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                        _M_impl.super__Vector_impl_data._M_start)->super_FabArray<amrex::FArrayBox>,
                     (MFIter *)&rhs_tmp,Rho_comp);
          lVar35 = (long)(int)local_1328.jstride;
          local_1460 = (double *)
                       ((lVar35 - local_1390) *
                        (long)vStack_13a8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start * 8 +
                        ((long)local_1328.p._4_4_ -
                        (long)vStack_13a8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) *
                        (long)scalars.second * 8 + (long)(int)local_1328.p * 8 +
                        (long)(int)vStack_13a8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage * -8 +
                       (long)scalars.first);
          for (; lVar35 <= local_1328.kstride._4_4_; lVar35 = lVar35 + 1) {
            pdVar24 = local_1460;
            for (lVar27 = (long)local_1328.p._4_4_; lVar27 <= (int)local_1328.kstride;
                lVar27 = lVar27 + 1) {
              if ((int)local_1328.p <= local_1328.jstride._4_4_) {
                lVar37 = (long)(int)local_1328.p;
                pdVar33 = pdVar24;
                do {
                  dVar44 = local_1370.p
                           [(lVar35 - local_1370.begin.z) * local_1370.kstride +
                            (lVar27 - local_1370.begin.y) * local_1370.jstride +
                            (lVar37 - local_1370.begin.x)];
                  pdVar15 = pdVar33;
                  uVar20 = uVar13;
                  while (bVar42 = uVar20 != 0, uVar20 = uVar20 - 1, bVar42) {
                    *pdVar15 = *pdVar15 * (1.0 / dVar44);
                    pdVar15 = pdVar15 + (long)vStack_13a8.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish;
                  }
                  lVar37 = lVar37 + 1;
                  pdVar33 = pdVar33 + 1;
                } while (local_1328.jstride._4_4_ + 1 != (int)lVar37);
              }
              pdVar24 = pdVar24 + (long)scalars.second;
            }
            local_1460 = local_1460 +
                         (long)vStack_13a8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
          }
          amrex::MFIter::operator++((MFIter *)&rhs_tmp);
        }
        amrex::MFIter::~MFIter((MFIter *)&rhs_tmp);
      }
      amrex::MLCellLinOp::setLevelBC
                ((MLCellLinOp *)&opn,0,&Soln,(MultiFab *)0x0,(MultiFab *)0x0,(MultiFab *)0x0);
      dVar44 = -(1.0 - local_1330) * dVar43;
      amrex::MLEBABecLap::setScalars(&opn,0.0,dVar44);
      setBeta(&opn,betan,betaComp,nComp);
      scalars.first = 4.94065645841247e-324;
      scalars.second = 0.0;
      vStack_13a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_13a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_13a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      amrex::MultiFab::MultiFab
                (&rhs_tmp,bxs,dm,nComp,2,(MFInfo *)&scalars,
                 (FabFactory<amrex::FArrayBox> *)
                 factory.
                 super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                 .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&vStack_13a8);
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                (&rhs_tmp.super_FabArray<amrex::FArrayBox>,0.0);
      __l_07._M_len = 1;
      __l_07._M_array = (iterator)&local_1328;
      local_1328.p = (double *)&rhs_tmp.super_FabArray<amrex::FArrayBox>;
      std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
                ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&scalars,__l_07,
                 (allocator_type *)&rhsscale);
      __l_08._M_len = 1;
      __l_08._M_array = (iterator)&local_12d8;
      local_12d8.p = (double *)&Soln;
      std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
                ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_1370,__l_08
                 ,(allocator_type *)&local_1030);
      amrex::MLMG::apply(&mgn,(Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                              &scalars,
                         (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                         &local_1370);
      std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base
                ((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_1370)
      ;
      std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base
                ((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&scalars);
      pMVar8 = amrex::EBFArrayBoxFactory::getVolFrac(pEVar7);
      amrex::single_level_weighted_redistribute(&rhs_tmp,&Rhs,pMVar8,0,nComp,geom);
      computeExtensiveFluxes
                (&mgn,&Soln,fluxn,fluxComp,nComp,(MultiFab *)&local_1268->navier_stokes->field_0x540
                 ,-dVar44 / dVar43);
      amrex::MultiFab::~MultiFab(&rhs_tmp);
    }
    else {
      for (lVar35 = 0; lVar35 != 3; lVar35 = lVar35 + 1) {
        amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  (&fluxn[lVar35]->super_FabArray<amrex::FArrayBox>,0.0,fluxComp,nComp,0);
      }
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                (&Rhs.super_FabArray<amrex::FArrayBox>,0.0);
    }
    amrex::MFIter::MFIter
              ((MFIter *)&rhs_tmp,
               (FabArrayBase *)
               *(S_new->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                super__Vector_impl_data._M_start,true);
    uVar13 = 0;
    if (0 < nComp) {
      uVar13 = (ulong)(uint)nComp;
    }
    while (rhs_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
           m_bndryReg.m_loshft.vect[0] <
           rhs_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
           m_bndryReg.m_loshft.vect[2]) {
      amrex::MFIter::tilebox(&local_11f4,(MFIter *)&rhs_tmp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)&scalars,&Rhs.super_FabArray<amrex::FArrayBox>,(MFIter *)&rhs_tmp
                );
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)&local_1370,&Soln.super_FabArray<amrex::FArrayBox>,
                 (MFIter *)&rhs_tmp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_1328,
                 &(*(S_new->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_start)->super_FabArray<amrex::FArrayBox>,
                 (MFIter *)&rhs_tmp,S_comp);
      if (rho_flag == 1) {
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_12d8,&rho_half->super_FabArray<amrex::FArrayBox>,(MFIter *)&rhs_tmp);
LAB_0035adb8:
        local_1228 = 0;
        LStack_1220 = 0;
        rhsscale = 0.0;
        _Stack_1230._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_1218.x = 1;
        local_1218.y = 1;
        local_1218.z = 1;
        local_120c._0_4_ = 0;
        local_120c._4_4_ = 0;
        local_120c._8_4_ = 0;
        local_120c._12_4_ = 0;
      }
      else {
        local_12d8.kstride = 0;
        local_12d8.nstride = 0;
        local_12d8.p = (double *)0x0;
        local_12d8.jstride = 0;
        local_12d8.begin.x = 1;
        local_12d8.begin.y = 1;
        local_12d8.begin.z = 1;
        local_12d8.end.x = 0;
        local_12d8.end.y = 0;
        local_12d8.end.z = 0;
        local_12d8.ncomp = 0;
        if (rho_flag != 3) goto LAB_0035adb8;
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)&rhsscale,
                   &(*(local_1280->
                      super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      _M_impl.super__Vector_impl_data._M_start)->super_FabArray<amrex::FArrayBox>,
                   (MFIter *)&rhs_tmp,Rho_comp);
      }
      if (alpha_in == (MultiFab *)0x0) {
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_1030,&Soln.super_FabArray<amrex::FArrayBox>,(MFIter *)&rhs_tmp);
      }
      else {
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_1030,&alpha_in->super_FabArray<amrex::FArrayBox>,(MFIter *)&rhs_tmp,
                   alpha_in_comp);
      }
      if (delta_rhs == (MultiFab *)0x0) {
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_e68,&Soln.super_FabArray<amrex::FArrayBox>,(MFIter *)&rhs_tmp);
      }
      else {
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_e68,&delta_rhs->super_FabArray<amrex::FArrayBox>,(MFIter *)&rhs_tmp,
                   rhsComp);
      }
      local_10c0 = (long)local_1370.begin.y;
      local_1128 = (long)local_1370.begin.z;
      lVar27 = (long)local_11f4.smallend.vect[0];
      local_1130 = (long)local_11f4.smallend.vect[1];
      local_1190 = (long)local_11f4.smallend.vect[2];
      local_10b8 = local_1370.jstride;
      local_1088 = local_1370.jstride * 8;
      local_1120 = local_1370.kstride;
      local_1138 = local_1370.kstride * 8;
      local_1140 = CONCAT44(local_1328.kstride._4_4_,(int)local_1328.kstride) * 8;
      local_1080 = CONCAT44(local_1328.jstride._4_4_,(int)local_1328.jstride) * 8;
      local_1148 = (long)local_12d8.begin.z;
      local_1150 = local_12d8.kstride;
      local_1158 = local_12d8.kstride * 8;
      local_10c8 = (long)local_12d8.begin.y;
      local_10d0 = local_12d8.jstride;
      local_1090 = local_12d8.jstride * 8;
      lVar35 = (long)local_12d8.begin.x;
      local_1160 = (long)vStack_13a8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start * 8;
      local_1098 = (long)scalars.second * 8;
      local_1168 = local_1030.kstride * 8;
      local_10a0 = local_1030.jstride * 8;
      local_1170 = local_e68.kstride * 8;
      local_10a8 = local_e68.jstride * 8;
      local_11a8 = local_1370.p;
      local_1240 = (double *)
                   ((local_1190 - local_1128) * local_1138 + (local_1130 - local_10c0) * local_1088
                    + lVar27 * 8 + (long)local_1370.begin.x * -8 + (long)local_1370.p);
      local_1248 = (local_1130 - local_1328.begin.y) * local_1080 +
                   (local_1190 - local_1328.begin.z) * local_1140 + lVar27 * 8 +
                   (long)local_1328.begin.x * -8 + (long)local_1328.p;
      local_11b0 = local_1328.nstride * 8;
      local_1198 = (local_1130 - local_10c8) * local_1090 + (local_1190 - local_1148) * local_1158 +
                   lVar27 * 8 + lVar35 * -8 + (long)local_12d8.p;
      local_1270 = local_11f4.bigend.vect[0];
      local_1250 = (local_1130 -
                   vStack_13a8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) * local_1098 +
                   (local_1190 - local_1390) * local_1160 + lVar27 * 8 +
                   (long)(int)vStack_13a8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage * -8 +
                   (long)scalars.first;
      local_11b8 = (long)vStack_13a8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish * 8;
      local_11a0 = (local_1130 - local_1030.begin.y) * local_10a0 +
                   (local_1190 - local_1030.begin.z) * local_1168 + lVar27 * 8 +
                   (long)local_1030.begin.x * -8 + (long)local_1030.p;
      local_1258 = (local_1130 - local_e68.begin.y) * local_10a8 +
                   (local_1190 - local_e68.begin.z) * local_1170 + lVar27 * 8 +
                   (long)local_e68.begin.x * -8 + (long)local_e68.p;
      local_11c0 = local_e68.nstride * 8;
      local_10d8 = _Stack_1230._M_pi;
      local_1178 = local_1228;
      local_10e0 = (long)local_1218.y;
      local_1180 = (long)local_1218.z;
      local_12e0 = (long)local_11f4.bigend.vect[1];
      local_1110 = (long)local_11f4.bigend.vect[2];
      local_11c8 = local_1370.nstride;
      local_11d0 = local_1370.nstride * 8;
      uVar20 = 0;
      while (uVar14 = uVar20, uVar14 != uVar13) {
        local_1118 = local_1370.p + uVar14 * local_1370.nstride;
        local_1278 = local_1240;
        lVar37 = local_1258;
        lVar29 = local_1198;
        lVar38 = local_1190;
        lVar41 = local_11a0;
        lVar9 = local_1250;
        lVar25 = local_1248;
        while (lVar23 = lVar25, lVar21 = lVar9, lVar18 = lVar41, lVar30 = lVar38, lVar26 = lVar29,
              lVar22 = lVar37, lVar30 <= local_1110) {
          local_10b0 = local_1118 + (lVar30 - local_1128) * local_1370.kstride;
          lVar9 = (lVar30 - local_1148) * local_12d8.kstride;
          local_1420 = local_1278;
          lVar29 = lVar18;
          lVar38 = lVar21;
          lVar41 = lVar23;
          local_1448 = lVar26;
          local_1440 = lVar22;
          for (lVar37 = local_1130; lVar37 <= local_12e0; lVar37 = lVar37 + 1) {
            if (local_11f4.smallend.vect[0] <= local_11f4.bigend.vect[0]) {
              lVar40 = (lVar37 - local_10c8) * local_12d8.jstride;
              lVar17 = 0;
              pdVar24 = local_1420;
              lVar25 = lVar27;
              do {
                if (delta_rhs == (MultiFab *)0x0) {
LAB_0035b4d0:
                  dVar44 = *(double *)(lVar41 + lVar17 * 8);
                  pdVar33 = local_10b0 +
                            (lVar37 - local_10c0) * local_1370.jstride +
                            (lVar25 - local_1370.begin.x);
                  *pdVar24 = dVar44;
                  lVar10 = (lVar30 - local_1180) * local_1228;
                  lVar28 = (lVar37 - local_10e0) * (long)_Stack_1230._M_pi;
                  lVar31 = (long)local_1218.x;
                  pEVar7 = (EBFArrayBoxFactory *)rhsscale;
                  if ((rho_flag == 3) ||
                     (lVar10 = lVar9, pdVar15 = pdVar24, lVar28 = lVar40, lVar31 = lVar35,
                     pEVar7 = (EBFArrayBoxFactory *)local_12d8.p, rho_flag == 1)) goto LAB_0035b527;
                }
                else {
                  dVar44 = *(double *)(local_1440 + lVar17 * 8) * dVar43 +
                           *(double *)(lVar38 + lVar17 * 8);
                  *(double *)(lVar38 + lVar17 * 8) = dVar44;
                  if (rho_flag != 1) goto LAB_0035b4d0;
                  *(double *)(lVar38 + lVar17 * 8) = dVar44 * *(double *)(local_1448 + lVar17 * 8);
                  dVar44 = *(double *)(lVar41 + lVar17 * 8);
                  *pdVar24 = dVar44;
                  lVar10 = lVar9;
                  pdVar33 = pdVar24;
                  lVar28 = lVar40;
                  lVar31 = lVar35;
                  pEVar7 = (EBFArrayBoxFactory *)local_12d8.p;
LAB_0035b527:
                  dVar44 = dVar44 * *(double *)
                                     ((long)pEVar7 +
                                     lVar17 * 8 + lVar28 * 8 + lVar10 * 8 + lVar31 * -8 + lVar27 * 8
                                     );
                  *pdVar33 = dVar44;
                  pdVar15 = pdVar33;
                }
                if (alpha_in != (MultiFab *)0x0) {
                  dVar44 = dVar44 * *(double *)(lVar29 + lVar17 * 8);
                  *pdVar15 = dVar44;
                }
                *(double *)(lVar38 + lVar17 * 8) = dVar44 + *(double *)(lVar38 + lVar17 * 8);
                lVar25 = lVar25 + 1;
                pdVar24 = pdVar24 + 1;
                lVar17 = lVar17 + 1;
              } while ((local_11f4.bigend.vect[0] - local_11f4.smallend.vect[0]) + 1 != (int)lVar17)
              ;
            }
            local_1420 = local_1420 + local_1370.jstride;
            lVar41 = lVar41 + local_1080;
            local_1448 = local_1448 + local_1090;
            lVar38 = lVar38 + local_1098;
            lVar29 = lVar29 + local_10a0;
            local_1440 = local_1440 + local_10a8;
          }
          local_1278 = local_1278 + local_1370.kstride;
          lVar37 = lVar22 + local_1170;
          lVar29 = lVar26 + local_1158;
          lVar41 = lVar18 + local_1168;
          lVar9 = lVar21 + local_1160;
          lVar25 = lVar23 + local_1140;
          local_12e8 = lVar30;
          local_1108 = lVar23;
          local_1100 = lVar26;
          local_10f8 = lVar21;
          local_10f0 = lVar18;
          local_10e8 = lVar22;
          lVar38 = lVar30 + 1;
        }
        local_1240 = local_1240 + local_1370.nstride;
        local_1248 = local_1248 + local_11b0;
        local_1250 = local_1250 + local_11b8;
        local_1258 = local_1258 + local_11c0;
        local_1188 = uVar14;
        uVar20 = uVar14 + 1;
      }
      amrex::MFIter::operator++((MFIter *)&rhs_tmp);
    }
    amrex::MFIter::~MFIter((MFIter *)&rhs_tmp);
    if (8 < local_1290) {
      amrex::MFIter::MFIter((MFIter *)&rhs_tmp,(FabArrayBase *)this_00,true);
      while (rhs_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
             m_bndryReg.m_loshft.vect[0] <
             rhs_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
             m_bndryReg.m_loshft.vect[2]) {
        amrex::MFIter::tilebox((Box *)&local_12d8,(MFIter *)&rhs_tmp);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&scalars,this_00,(MFIter *)&rhs_tmp);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_1370,
                   &(S_new->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[1]->super_FabArray<amrex::FArrayBox>,
                   (MFIter *)&rhs_tmp,S_comp);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)&local_1328,
                   &(local_1288->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                    ).super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[1]->super_FabArray<amrex::FArrayBox>,
                   (MFIter *)&rhs_tmp,Rho_comp);
        lVar27 = (long)local_12d8.p._4_4_;
        lVar35 = (long)(int)local_12d8.jstride;
        lVar37 = (long)(int)local_12d8.p;
        local_12e0 = CONCAT44(local_1328.kstride._4_4_,(int)local_1328.kstride);
        pdVar24 = (double *)
                  ((lVar35 - local_1370.begin.z) * local_1370.kstride * 8 +
                   (lVar27 - local_1370.begin.y) * local_1370.jstride * 8 + lVar37 * 8 +
                   (long)local_1370.begin.x * -8 + (long)local_1370.p);
        pdVar33 = (double *)
                  ((lVar35 - local_1390) *
                   (long)vStack_13a8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start * 8 +
                   (lVar27 - vStack_13a8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) *
                   (long)scalars.second * 8 + lVar37 * 8 +
                   (long)(int)vStack_13a8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage * -8 +
                  (long)scalars.first);
        local_12e8 = (long)local_1328.begin.z;
        for (; lVar35 <= local_12d8.kstride._4_4_; lVar35 = lVar35 + 1) {
          pdVar15 = pdVar24;
          pdVar34 = pdVar33;
          for (lVar29 = lVar27; lVar29 <= (int)local_12d8.kstride; lVar29 = lVar29 + 1) {
            if ((int)local_12d8.p <= local_12d8.jstride._4_4_) {
              uVar20 = uVar13;
              pdVar32 = pdVar15;
              pdVar39 = pdVar34;
              lVar38 = lVar37;
              pdVar16 = pdVar34;
              pdVar11 = pdVar15;
              do {
                while (uVar20 != 0) {
                  *pdVar39 = *pdVar32;
                  uVar20 = uVar20 - 1;
                  pdVar32 = pdVar32 + local_1370.nstride;
                  pdVar39 = pdVar39 + (long)vStack_13a8.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish;
                }
                if (rho_flag == 2) {
                  dVar44 = *(double *)
                            ((long)local_1328.p +
                            (lVar38 - local_1328.begin.x) * 8 +
                            (lVar29 - local_1328.begin.y) *
                            CONCAT44(local_1328.jstride._4_4_,(int)local_1328.jstride) * 8 +
                            (lVar35 - local_12e8) * local_12e0 * 8);
                  uVar20 = uVar13;
                  pdVar32 = pdVar16;
                  while (bVar42 = uVar20 != 0, uVar20 = uVar20 - 1, bVar42) {
                    *pdVar32 = *pdVar32 * (1.0 / dVar44);
                    pdVar32 = pdVar32 + (long)vStack_13a8.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish;
                  }
                }
                lVar38 = lVar38 + 1;
                pdVar39 = pdVar16 + 1;
                pdVar32 = pdVar11 + 1;
                uVar20 = uVar13;
                pdVar16 = pdVar39;
                pdVar11 = pdVar32;
              } while (local_12d8.jstride._4_4_ + 1 != (int)lVar38);
            }
            pdVar15 = pdVar15 + local_1370.jstride;
            pdVar34 = pdVar34 + (long)scalars.second;
          }
          pdVar24 = pdVar24 + local_1370.kstride;
          pdVar33 = pdVar33 + (long)vStack_13a8.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
        }
        amrex::MFIter::operator++((MFIter *)&rhs_tmp);
      }
      amrex::MFIter::~MFIter((MFIter *)&rhs_tmp);
      amrex::MLLinOp::setCoarseFineBC((MLLinOp *)&opnp1,(MultiFab *)this_00,cratio->vect[0]);
    }
    amrex::MFIter::MFIter((MFIter *)&rhs_tmp,(FabArrayBase *)&Soln,true);
    while (rhs_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
           m_bndryReg.m_loshft.vect[0] <
           rhs_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
           m_bndryReg.m_loshft.vect[2]) {
      amrex::MFIter::growntilebox((Box *)&local_12d8,(MFIter *)&rhs_tmp,1);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)&scalars,&Soln.super_FabArray<amrex::FArrayBox>,
                 (MFIter *)&rhs_tmp);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_1370,
                 &(*(S_new->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_start)->super_FabArray<amrex::FArrayBox>,
                 (MFIter *)&rhs_tmp,S_comp);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((Array4<const_double> *)&local_1328,
                 &(*(local_1288->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                    ).super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_start)->super_FabArray<amrex::FArrayBox>,
                 (MFIter *)&rhs_tmp,Rho_comp);
      lVar27 = (long)local_12d8.p._4_4_;
      lVar35 = (long)(int)local_12d8.jstride;
      lVar37 = (long)(int)local_12d8.p;
      local_12e0 = CONCAT44(local_1328.kstride._4_4_,(int)local_1328.kstride);
      pdVar24 = (double *)
                ((lVar35 - local_1370.begin.z) * local_1370.kstride * 8 +
                 (lVar27 - local_1370.begin.y) * local_1370.jstride * 8 + lVar37 * 8 +
                 (long)local_1370.begin.x * -8 + (long)local_1370.p);
      pdVar33 = (double *)
                ((lVar35 - local_1390) *
                 (long)vStack_13a8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start * 8 +
                 (lVar27 - vStack_13a8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) *
                 (long)scalars.second * 8 + lVar37 * 8 +
                 (long)(int)vStack_13a8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage * -8 +
                (long)scalars.first);
      local_12e8 = (long)local_1328.begin.z;
      for (; lVar35 <= local_12d8.kstride._4_4_; lVar35 = lVar35 + 1) {
        pdVar15 = pdVar24;
        pdVar34 = pdVar33;
        for (lVar29 = lVar27; lVar29 <= (int)local_12d8.kstride; lVar29 = lVar29 + 1) {
          if ((int)local_12d8.p <= local_12d8.jstride._4_4_) {
            uVar20 = uVar13;
            pdVar32 = pdVar15;
            pdVar39 = pdVar34;
            lVar38 = lVar37;
            pdVar16 = pdVar34;
            pdVar11 = pdVar15;
            do {
              while (uVar20 != 0) {
                *pdVar39 = *pdVar32;
                uVar20 = uVar20 - 1;
                pdVar32 = pdVar32 + local_1370.nstride;
                pdVar39 = pdVar39 + (long)vStack_13a8.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish;
              }
              if (rho_flag == 2) {
                dVar44 = *(double *)
                          ((long)local_1328.p +
                          (lVar38 - local_1328.begin.x) * 8 +
                          (lVar29 - local_1328.begin.y) *
                          CONCAT44(local_1328.jstride._4_4_,(int)local_1328.jstride) * 8 +
                          (lVar35 - local_12e8) * local_12e0 * 8);
                uVar20 = uVar13;
                pdVar32 = pdVar16;
                while (bVar42 = uVar20 != 0, uVar20 = uVar20 - 1, bVar42) {
                  *pdVar32 = *pdVar32 * (1.0 / dVar44);
                  pdVar32 = pdVar32 + (long)vStack_13a8.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish;
                }
              }
              lVar38 = lVar38 + 1;
              pdVar39 = pdVar16 + 1;
              pdVar32 = pdVar11 + 1;
              uVar20 = uVar13;
              pdVar16 = pdVar39;
              pdVar11 = pdVar32;
            } while (local_12d8.jstride._4_4_ + 1 != (int)lVar38);
          }
          pdVar15 = pdVar15 + local_1370.jstride;
          pdVar34 = pdVar34 + (long)scalars.second;
        }
        pdVar24 = pdVar24 + local_1370.kstride;
        pdVar33 = pdVar33 + (long)vStack_13a8.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
      }
      amrex::MFIter::operator++((MFIter *)&rhs_tmp);
    }
    amrex::MFIter::~MFIter((MFIter *)&rhs_tmp);
    amrex::MLCellLinOp::setLevelBC
              ((MLCellLinOp *)&opnp1,0,&Soln,(MultiFab *)0x0,(MultiFab *)0x0,(MultiFab *)0x0);
    rhsscale = 1.0;
    scalars.first = 0.0;
    scalars.second = 0.0;
    amrex::MultiFab::MultiFab(&rhs_tmp);
    local_1330 = local_1330 * dVar43;
    iVar19 = 0;
    if (rho_flag != 1) {
      local_1260 = *(local_1288->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                    ).super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      iVar19 = Rho_comp;
    }
    computeAlpha(&rhs_tmp,&scalars,1.0,local_1330,&rhsscale,alpha_in,alpha_in_comp,rho_flag,
                 local_1260,iVar19);
    amrex::MLEBABecLap::setScalars(&opnp1,scalars.first,scalars.second);
    amrex::MLEBABecLap::setACoeffs(&opnp1,0,&rhs_tmp);
    amrex::MultiFab::~MultiFab(&rhs_tmp);
    setBeta(&opnp1,betanp1,betaComp,nComp);
    amrex::MultiFab::mult(&Rhs,rhsscale,0,nComp,0);
    a_tol_rel = visc_tol;
    a_tol_abs = get_scaled_abs_tol(&Rhs,visc_tol);
    __l_09._M_len = 1;
    __l_09._M_array = (iterator)&local_1370;
    local_1370.p = (double *)&Soln;
    std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
              ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&rhs_tmp,__l_09,
               (allocator_type *)&local_12d8);
    __l_10._M_len = 1;
    __l_10._M_array = (iterator)&local_1328;
    local_1328.p = (double *)&Rhs;
    std::vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::vector
              ((vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)&scalars
               ,__l_10,(allocator_type *)&local_1030);
    amrex::MLMG::solve(&mgnp1,(Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                              &rhs_tmp,
                       (Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                       &scalars,a_tol_rel,a_tol_abs,(char *)0x0);
    std::_Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::
    ~_Vector_base((_Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *
                  )&scalars);
    std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base
              ((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&rhs_tmp);
    computeExtensiveFluxes
              (&mgnp1,&Soln,fluxnp1,fluxComp,nComp,
               (MultiFab *)&local_1268->navier_stokes->field_0x540,local_1330 / dVar43);
    amrex::MFIter::MFIter
              ((MFIter *)&rhs_tmp,
               (FabArrayBase *)
               *(S_new->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                super__Vector_impl_data._M_start,true);
    if (rho_flag != 2) {
      local_1378 = S_comp;
    }
    while (rhs_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
           m_bndryReg.m_loshft.vect[0] <
           rhs_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
           m_bndryReg.m_loshft.vect[2]) {
      amrex::MFIter::tilebox((Box *)&local_12d8,(MFIter *)&rhs_tmp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)&scalars,
                 &(*(S_new->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_start)->super_FabArray<amrex::FArrayBox>,
                 (MFIter *)&rhs_tmp,S_comp);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_1370,&Soln.super_FabArray<amrex::FArrayBox>,(MFIter *)&rhs_tmp);
      pVVar12 = S_new;
      if (rho_flag == 2) {
        pVVar12 = local_1288;
      }
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((Array4<const_double> *)&local_1328,
                 &(*(pVVar12->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_start)->super_FabArray<amrex::FArrayBox>,
                 (MFIter *)&rhs_tmp,local_1378);
      lVar29 = (long)local_12d8.p._4_4_;
      lVar35 = (long)(int)local_12d8.jstride;
      lVar9 = CONCAT44(local_1328.kstride._4_4_,(int)local_1328.kstride) * 8;
      lVar38 = CONCAT44(local_1328.jstride._4_4_,(int)local_1328.jstride) * 8;
      lVar41 = (long)(int)local_12d8.p;
      lVar37 = (lVar29 - vStack_13a8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) *
               (long)scalars.second * 8 +
               (lVar35 - local_1390) *
               (long)vStack_13a8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start * 8 + lVar41 * 8 +
               (long)(int)vStack_13a8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage * -8 +
               (long)scalars.first;
      lVar27 = (lVar29 - local_1370.begin.y) * local_1370.jstride * 8 +
               (lVar35 - local_1370.begin.z) * local_1370.kstride * 8 + lVar41 * 8 +
               (long)local_1370.begin.x * -8 + (long)local_1370.p;
      for (uVar20 = 0; lVar25 = lVar27, lVar22 = lVar37,
          lVar26 = (lVar29 - local_1328.begin.y) * lVar38 + (lVar35 - local_1328.begin.z) * lVar9 +
                   lVar41 * 8 + (long)local_1328.begin.x * -8 + (long)local_1328.p, lVar30 = lVar35,
          uVar20 != uVar13; uVar20 = uVar20 + 1) {
        for (; lVar18 = lVar26, lVar21 = lVar25, lVar23 = lVar22, lVar17 = lVar29,
            lVar30 <= local_12d8.kstride._4_4_; lVar30 = lVar30 + 1) {
          for (; lVar17 <= (int)local_12d8.kstride; lVar17 = lVar17 + 1) {
            if ((int)local_12d8.p <= local_12d8.jstride._4_4_) {
              lVar40 = 0;
              do {
                dVar43 = *(double *)(lVar21 + lVar40 * 8);
                *(double *)(lVar23 + lVar40 * 8) = dVar43;
                if (rho_flag == 2) {
                  *(double *)(lVar23 + lVar40 * 8) = dVar43 * *(double *)(lVar18 + lVar40 * 8);
                }
                lVar40 = lVar40 + 1;
              } while ((local_12d8.jstride._4_4_ - (int)local_12d8.p) + 1 != (int)lVar40);
            }
            lVar18 = lVar18 + lVar38;
            lVar23 = lVar23 + (long)scalars.second * 8;
            lVar21 = lVar21 + local_1370.jstride * 8;
          }
          lVar25 = lVar25 + local_1370.kstride * 8;
          lVar22 = lVar22 + (long)vStack_13a8.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start * 8;
          lVar26 = lVar26 + lVar9;
        }
        lVar37 = lVar37 + (long)vStack_13a8.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish * 8;
        lVar27 = lVar27 + local_1370.nstride * 8;
      }
      amrex::MFIter::operator++((MFIter *)&rhs_tmp);
    }
    amrex::MFIter::~MFIter((MFIter *)&rhs_tmp);
    if (verbose != 0) {
      dVar43 = amrex::ParallelDescriptor::second();
      poVar5 = amrex::OutStream();
      amrex::Print::Print((Print *)&rhs_tmp,poVar5);
      pIVar2 = &rhs_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
                m_bndryReg.m_typ;
      std::operator<<((ostream *)pIVar2,"Diffusion::diffuse_scalar() time: ");
      std::ostream::_M_insert<double>(dVar43 - local_11d8);
      std::operator<<((ostream *)pIVar2,'\n');
      amrex::Print::~Print((Print *)&rhs_tmp);
    }
    amrex::MLMG::~MLMG(&mgnp1);
    amrex::MLEBABecLap::~MLEBABecLap(&opnp1);
    amrex::MLMG::~MLMG(&mgn);
    amrex::MLEBABecLap::~MLEBABecLap(&opn);
    (*(this_00->super_FabArrayBase)._vptr_FabArrayBase[1])();
    amrex::MultiFab::~MultiFab(&Soln);
    amrex::MultiFab::~MultiFab(&Rhs);
  }
  return;
}

Assistant:

void
Diffusion::diffuse_scalar (const Vector<MultiFab*>&  S_old,
                           const Vector<MultiFab*>&  Rho_old,
                           Vector<MultiFab*>&        S_new,
                           const Vector<MultiFab*>&  Rho_new,
                           int                       S_comp,
                           int                       nComp,
                           int                       Rho_comp,
                           Real                      prev_time,
                           Real                      curr_time,
                           Real                      be_cn_theta,
                           const MultiFab&           rho_half,
                           int                       rho_flag,
                           MultiFab* const*          fluxn,
                           MultiFab* const*          fluxnp1,
                           int                       fluxComp,
                           MultiFab*                 delta_rhs,
                           int                       rhsComp,
                           const MultiFab*           alpha_in,
                           int                       alpha_in_comp,
                           const MultiFab* const*    betan,
                           const MultiFab* const*    betanp1,
                           int                       betaComp,
                           const IntVect&            cratio,
                           const BCRec&              bc,
                           const Geometry&           geom,
                           bool                      add_old_time_divFlux,
                           const amrex::Vector<int>& a_is_diffusive)
{
    //
    // This routine expects that physical BC's have been loaded into
    // the grow cells of the old and new state at this level.  If rho_flag==2,
    // the values there are rho.phi, where phi is the quantity being diffused.
    // Values in these cells will be preserved.  Also, if there are any
    // explicit update terms, these have already incremented the new state
    // on the valid region (i.e., on the valid region the new state is the old
    // state + dt*Div(explicit_fluxes), e.g.)
    //

    if (verbose)
      amrex::Print() << "... Diffusion::diffuse_scalar(): \n"
                     << " lev: " << level << '\n';

    // Velocity components should go to tensor solver
    if (S_comp <= Xvel && Xvel <= S_comp+nComp-1){
       amrex::Abort("Diffusion::diffuse_scalar(): velocity component(s) attemping to use scalar solver. Velocity must use tensor solver.\n");
    }

    // Check if scalars are diffusive type:
    // all the nComp scalars must be of the same type
    int diffType = a_is_diffusive[0];
    for (int comp = 1; comp < nComp; comp++) {
        if (a_is_diffusive[comp] != diffType) {
            amrex::Abort("All the scalars must be either diffusive or non-diffusive when calling diffuse_scalar");
        }
    }

    // If all non-diffusive, set flux to zero and exit
    if (diffType == 0) {
        for (int idim = 0; idim < AMREX_SPACEDIM; idim++)
        {
            if (fluxn[idim]!= 0 && fluxnp1[idim]!= 0)
            {
                fluxn[idim]->setVal(0.0,fluxComp,nComp);
                fluxnp1[idim]->setVal(0.0,fluxComp,nComp);
            }
        }
        return;
    }

    bool has_coarse_data = S_new.size() > 1;

    const Real strt_time = ParallelDescriptor::second();

    int allthere, allnull;
    checkBeta(betan, allthere, allnull);
    checkBeta(betanp1, allthere);
    if (allnull && add_old_time_divFlux && be_cn_theta!=1)
       amrex::Abort("Diffusion::diffuse_scalar: Constant diffusivity case no longer supported separately. Must set non-zero beta.");

    //
    // No ghost cells are needed for MLMG in most cases. Except for
    // for cell-centered solver, you need to call setLevelBC, and that
    // needs to have 1 ghost cell if there is Dirichlet BC.
    //
    const int ng = 1;

    Real dt = curr_time - prev_time;
    AMREX_ASSERT(S_new[0]->nGrow()>0);
    if (S_old.size()>0) AMREX_ASSERT(S_old[0]->nGrow()>0);
    const BoxArray& ba = S_new[0]->boxArray();
    const DistributionMapping& dm = S_new[0]->DistributionMap();
    const DistributionMapping* dmc = (has_coarse_data ? &(S_new[1]->DistributionMap()) : 0);
    const BoxArray* bac = (has_coarse_data ? &(S_new[1]->boxArray()) : 0);

    const auto& factory = S_new[0]->Factory();

    MultiFab Rhs(ba,dm,nComp,0,MFInfo(),factory);
    MultiFab Soln(ba,dm,nComp,ng,MFInfo(),factory);

    auto Solnc = std::unique_ptr<MultiFab>(new MultiFab());
    if (has_coarse_data)
    {
      Solnc->define(*bac, *dmc, nComp, 0, MFInfo(), S_new[1]->Factory());
    }

    std::array<LinOpBCType,AMREX_SPACEDIM> mlmg_lobc;
    std::array<LinOpBCType,AMREX_SPACEDIM> mlmg_hibc;

    //
    // Create operator at time n and n+1
    //
    LPInfo infon;
    infon.setAgglomeration(agglomeration);
    infon.setConsolidation(consolidation);
    infon.setMaxCoarseningLevel(0);

#ifdef AMREX_USE_EB
    const auto& ebf = &(dynamic_cast<EBFArrayBoxFactory const&>(factory));
    MLEBABecLap opn({geom}, {ba}, {dm}, infon, {ebf}, nComp);
#else
    MLABecLaplacian opn({geom}, {ba}, {dm}, infon, {}, nComp);
#endif

    opn.setMaxOrder(max_order);
    MLMG mgn(opn);
    mgn.setVerbose(verbose);

    LPInfo infonp1;
    infonp1.setAgglomeration(agglomeration);
    infonp1.setConsolidation(consolidation);

#ifdef AMREX_USE_EB
    MLEBABecLap opnp1({geom}, {ba}, {dm}, infonp1, {ebf}, nComp);
#else
    MLABecLaplacian opnp1({geom}, {ba}, {dm}, infonp1, {}, nComp);
#endif
    opnp1.setMaxOrder(max_order);

    MLMG mgnp1(opnp1);
    if (use_hypre)
    {
      mgnp1.setBottomSolver(MLMG::BottomSolver::hypre);
      mgnp1.setBottomVerbose(hypre_verbose);
    }
    mgnp1.setMaxFmgIter(max_fmg_iter);
    mgnp1.setVerbose(verbose);

    setDomainBC(mlmg_lobc, mlmg_hibc, bc); // Same for all comps, by assumption
    opn.setDomainBC(mlmg_lobc, mlmg_hibc);
    opnp1.setDomainBC(mlmg_lobc, mlmg_hibc);

    if (verbose)
    {
       amrex::Print() << "diffusing of " << nComp << " scalars \n"
                      << "rho flag "<< rho_flag << "\n";
    }

    int sigma = S_comp;

    if (add_old_time_divFlux && be_cn_theta!=1) {
        Real a = 0.0;
        Real b = -(1.0-be_cn_theta)*dt;

        if(verbose)
             Print()<<"Adding old time diff ...\n";

        {
            if (has_coarse_data) {
                MultiFab::Copy(*Solnc,*S_old[1],sigma,0,nComp,0);
                if (rho_flag == 2) {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
                    for (MFIter mfi(*Solnc, TilingIfNotGPU()); mfi.isValid(); ++mfi)
                    {
                        const Box& bx = mfi.tilebox();
                        auto const& sol_arr = Solnc->array(mfi);
                        auto const& rho_arr = Rho_old[1]->const_array(mfi,Rho_comp);
                        amrex::ParallelFor(bx, [sol_arr, rho_arr, nComp]
                        AMREX_GPU_DEVICE(int i, int j, int k) noexcept
                        {
                            Real rhoInv = 1.0 / rho_arr(i,j,k);
                            for (int n = 0; n < nComp; ++n) {
                               sol_arr(i,j,k,n) *= rhoInv;
                            }
                        });
                    }
                }
                opn.setCoarseFineBC(Solnc.get(), cratio[0]);
            }
            MultiFab::Copy(Soln,*S_old[0],sigma,0,nComp,ng);
            if (rho_flag == 2) {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
                for (MFIter mfi(Soln, TilingIfNotGPU()); mfi.isValid(); ++mfi)
                {
                    const Box& bx = mfi.growntilebox(ng);
                    auto const& sol_arr = Soln.array(mfi);
                    auto const& rho_arr = Rho_old[0]->const_array(mfi,Rho_comp);
                    amrex::ParallelFor(bx, [sol_arr, rho_arr, nComp]
                    AMREX_GPU_DEVICE(int i, int j, int k) noexcept
                    {
                        Real rhoInv = 1.0 / rho_arr(i,j,k);
                        for (int n = 0; n < nComp; ++n) {
                           sol_arr(i,j,k,n) *= rhoInv;
                        }
                    });
                }
            }
            opn.setLevelBC(0, &Soln);
        }

        opn.setScalars(a,b);
        setBeta(opn,betan,betaComp,nComp);

#ifdef AMREX_USE_EB
        MultiFab rhs_tmp(ba,dm,nComp,2,MFInfo(),factory);
        rhs_tmp.setVal(0.);
        mgn.apply({&rhs_tmp},{&Soln});

        const amrex::MultiFab* weights;
        weights = &(ebf->getVolFrac());

        amrex::single_level_weighted_redistribute(rhs_tmp, Rhs, *weights, 0, nComp, geom);
#else
        mgn.apply({&Rhs},{&Soln});
#endif
        computeExtensiveFluxes(mgn, Soln, fluxn, fluxComp, nComp,
			       navier_stokes->area, -b/dt);
    } else {
        for (int idim = 0; idim < AMREX_SPACEDIM; idim++)
        {
          fluxn[idim]->setVal(0.0,fluxComp,nComp);
        }
        Rhs.setVal(0.0);
    }

    // Get local version of the switch
    int has_alpha     = (alpha_in  != 0) ? 1 : 0;
    int has_delta_rhs = (delta_rhs != 0) ? 1 : 0;

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(*S_new[0], TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        auto const& rhs      = Rhs.array(mfi);
        auto const& solution = Soln.array(mfi);
        auto const& snew     = S_new[0]->array(mfi,sigma);
        Array4<const Real> dummy;
        auto const& rhoHalf  = (rho_flag == 1) ? rho_half.const_array(mfi) : dummy;
        auto const& rho_old  = (rho_flag == 3) ? Rho_old[0]->const_array(mfi,Rho_comp) : dummy;
        auto const& alpha    = (has_alpha) ? alpha_in->const_array(mfi,alpha_in_comp) : Soln.const_array(mfi);
        auto const& deltarhs = (has_delta_rhs) ? delta_rhs->const_array(mfi,rhsComp) : Soln.const_array(mfi);
        amrex::ParallelFor(bx, nComp, [rhs, solution, snew, rhoHalf, rho_old, alpha, deltarhs,
                                has_alpha, has_delta_rhs, rho_flag, dt ]
        AMREX_GPU_DEVICE(int i, int j, int k, int n) noexcept
        {
            // Add body sources
            if ( has_delta_rhs ) {
                rhs(i,j,k,n) += deltarhs(i,j,k,n) * dt;
                if ( rho_flag == 1 ) {
                    rhs(i,j,k,n) *= rhoHalf(i,j,k);
                }
            }
            // Always do : copy S_new into Soln
            //             add Soln to Rhs
            solution(i,j,k,n) = snew(i,j,k,n);
            if ( rho_flag == 1) {
                solution(i,j,k,n) *= rhoHalf(i,j,k);
            } else if ( rho_flag == 3 ) {
                solution(i,j,k,n) *= rho_old(i,j,k);
            }
            if ( has_alpha ) {
                solution(i,j,k,n) *= alpha(i,j,k);
            }
            rhs(i,j,k,n) += solution(i,j,k,n);
        });
    }

    //
    // Set C&F solutions, levelBCs and CoarseFineBCs
    //
    if (has_coarse_data) {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(*Solnc, TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            auto const& sol_arr  = Solnc->array(mfi);
            auto const& snew_arr = S_new[1]->const_array(mfi,sigma);
            auto const& rho_arr  = Rho_new[1]->const_array(mfi,Rho_comp);
            amrex::ParallelFor(bx, [sol_arr, snew_arr, rho_arr, nComp, rho_flag]
            AMREX_GPU_DEVICE(int i, int j, int k) noexcept
            {
                for (int n = 0; n < nComp; ++n) {
                   sol_arr(i,j,k,n) = snew_arr(i,j,k,n);
                }
                if (rho_flag == 2) {
                    Real rhoInv = 1.0 / rho_arr(i,j,k);
                    for (int n = 0; n < nComp; ++n) {
                       sol_arr(i,j,k,n) *= rhoInv;
                    }
                }
            });
        }
        opnp1.setCoarseFineBC(Solnc.get(), cratio[0]);
    }
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(Soln, TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.growntilebox(ng);
        auto const& sol_arr  = Soln.array(mfi);
        auto const& snew_arr = S_new[0]->const_array(mfi,sigma);
        auto const& rho_arr  = Rho_new[0]->const_array(mfi,Rho_comp);
        amrex::ParallelFor(bx, [sol_arr, snew_arr, rho_arr, nComp, rho_flag]
        AMREX_GPU_DEVICE(int i, int j, int k) noexcept
        {
            for (int n = 0; n < nComp; ++n) {
               sol_arr(i,j,k,n) = snew_arr(i,j,k,n);
            }
            if (rho_flag == 2) {
                Real rhoInv = 1.0 / rho_arr(i,j,k);
                for (int n = 0; n < nComp; ++n) {
                   sol_arr(i,j,k,n) *= rhoInv;
                }
            }
        });
    }
    opnp1.setLevelBC(0, &Soln);

    Real a = 1.0;
    Real b = be_cn_theta*dt;
    Real rhsscale = 1.0;
    {
        std::pair<Real,Real> scalars;
        MultiFab alpha;
        const MultiFab* rho = (rho_flag == 1) ? &rho_half : Rho_new[0];
        int rhoComp = (rho_flag == 1 ) ? 0 : Rho_comp;

        computeAlpha(alpha, scalars, a, b,
                     &rhsscale, alpha_in, alpha_in_comp,
                     rho_flag, rho, rhoComp);
        opnp1.setScalars(scalars.first, scalars.second);
        opnp1.setACoeffs(0, alpha);
    }

    setBeta(opnp1,betanp1,betaComp,nComp);

    Rhs.mult(rhsscale,0,nComp);
    const Real S_tol     = visc_tol;
    const Real S_tol_abs = get_scaled_abs_tol(Rhs, visc_tol);

    mgnp1.solve({&Soln}, {&Rhs}, S_tol, S_tol_abs);

    computeExtensiveFluxes(mgnp1, Soln, fluxnp1, fluxComp, nComp,
			   navier_stokes->area, b/dt);

    //
    // Copy into state variable at new time, without bc's and * rho if needed
    //
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(*S_new[0], TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
       const Box& bx = mfi.tilebox();
       const auto& snew     = S_new[0]->array(mfi, sigma);
       const auto& solution = Soln.const_array(mfi);
       const auto& rhonew   = (rho_flag == 2) ? Rho_new[0]->const_array(mfi,Rho_comp) : S_new[0]->const_array(mfi,sigma);
       amrex::ParallelFor(bx, nComp, [snew, solution, rhonew, rho_flag]
       AMREX_GPU_DEVICE(int i, int j, int k, int n) noexcept
       {
          snew(i,j,k,n) = solution(i,j,k,n);
          if (rho_flag == 2) {
             snew(i,j,k,n) *= rhonew(i,j,k);
          }
       });
    }

    if (verbose) {
       const int IOProc   = ParallelDescriptor::IOProcessorNumber();
       Real      run_time = ParallelDescriptor::second() - strt_time;
       ParallelDescriptor::ReduceRealMax(run_time,IOProc);
       amrex::Print() << "Diffusion::diffuse_scalar() time: " << run_time << '\n';
    }
}